

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O2

void __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::makeBorderBucket
          (RelationsGraph<dg::vr::ValueRelations> *this,Bucket *b,size_t id)

{
  size_t sVar1;
  size_t local_20;
  
  local_20 = id;
  sVar1 = getBorderId(this,b);
  if (sVar1 != id) {
    std::
    vector<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>,std::allocator<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>>>
    ::emplace_back<unsigned_long&,dg::vr::Bucket_const&>
              ((vector<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>,std::allocator<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>>>
                *)&this->borderBuckets,&local_20,b);
  }
  return;
}

Assistant:

void makeBorderBucket(const Bucket &b, size_t id) {
        size_t currentId = getBorderId(b);
        if (currentId == id)
            return;

        assert(getBorderB(id) == nullptr);
        assert(getBorderId(b) == std::string::npos);
        borderBuckets.emplace_back(id, b);
    }